

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SyntaxClone.cpp
# Opt level: O0

int slang::syntax::deep::clone(__fn *__fn,void *__child_stack,int __flags,void *__arg,...)

{
  GenerateBlockSyntax *pGVar1;
  Token TVar2;
  Token TVar3;
  BumpAllocator *in_stack_00000028;
  SyntaxList<slang::syntax::AttributeInstanceSyntax> *in_stack_00000030;
  BumpAllocator *in_stack_000000c8;
  Token *in_stack_000000d0;
  BumpAllocator *in_stack_ffffffffffffff78;
  NamedBlockClauseSyntax *in_stack_ffffffffffffff80;
  NamedBlockClauseSyntax *local_78;
  NamedBlockClauseSyntax *local_68;
  
  deepClone<slang::syntax::AttributeInstanceSyntax>(in_stack_00000030,in_stack_00000028);
  if (*(NamedBlockClauseSyntax **)((long)__fn + 0x50) != (NamedBlockClauseSyntax *)0x0) {
    deepClone<slang::syntax::NamedLabelSyntax>
              ((NamedLabelSyntax *)in_stack_ffffffffffffff80,in_stack_ffffffffffffff78);
  }
  TVar2 = parsing::Token::deepClone(in_stack_000000d0,in_stack_000000c8);
  if (*(NamedBlockClauseSyntax **)((long)__fn + 0x68) == (NamedBlockClauseSyntax *)0x0) {
    local_68 = (NamedBlockClauseSyntax *)0x0;
  }
  else {
    local_68 = deepClone<slang::syntax::NamedBlockClauseSyntax>
                         (in_stack_ffffffffffffff80,in_stack_ffffffffffffff78);
  }
  deepClone<slang::syntax::MemberSyntax>
            ((SyntaxList<slang::syntax::MemberSyntax> *)in_stack_00000030,in_stack_00000028);
  TVar3 = parsing::Token::deepClone(in_stack_000000d0,in_stack_000000c8);
  if (*(NamedBlockClauseSyntax **)((long)__fn + 0xb8) == (NamedBlockClauseSyntax *)0x0) {
    local_78 = (NamedBlockClauseSyntax *)0x0;
  }
  else {
    local_78 = deepClone<slang::syntax::NamedBlockClauseSyntax>
                         (in_stack_ffffffffffffff80,in_stack_ffffffffffffff78);
  }
  pGVar1 = BumpAllocator::
           emplace<slang::syntax::GenerateBlockSyntax,slang::syntax::SyntaxList<slang::syntax::AttributeInstanceSyntax>&,slang::syntax::NamedLabelSyntax*,slang::parsing::Token,slang::syntax::NamedBlockClauseSyntax*,slang::syntax::SyntaxList<slang::syntax::MemberSyntax>&,slang::parsing::Token,slang::syntax::NamedBlockClauseSyntax*>
                     ((BumpAllocator *)TVar2.info,TVar2._0_8_,(NamedLabelSyntax **)local_68,
                      (Token *)TVar3.info,TVar3._0_8_,
                      (SyntaxList<slang::syntax::MemberSyntax> *)local_78,(Token *)__child_stack,
                      (NamedBlockClauseSyntax **)__fn);
  return (int)pGVar1;
}

Assistant:

static SyntaxNode* clone(const GenerateBlockSyntax& node, BumpAllocator& alloc) {
    return alloc.emplace<GenerateBlockSyntax>(
        *deepClone(node.attributes, alloc),
        node.label ? deepClone(*node.label, alloc) : nullptr,
        node.begin.deepClone(alloc),
        node.beginName ? deepClone(*node.beginName, alloc) : nullptr,
        *deepClone(node.members, alloc),
        node.end.deepClone(alloc),
        node.endName ? deepClone(*node.endName, alloc) : nullptr
    );
}